

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_boundary_z5_operators<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                *matrix)

{
  uint uVar1;
  pointer pSVar2;
  undefined8 uVar3;
  pointer puVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  _Rb_tree_node_base *p_Var8;
  size_t sVar9;
  uint uVar10;
  bool bVar11;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  undefined8 local_4c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container_4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container_3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container_5;
  undefined8 local_440;
  undefined8 local_438;
  char *local_430;
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  col4;
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  col3;
  char *local_370;
  char *local_368;
  shared_count sStack_360;
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  col2;
  undefined8 local_300;
  Column_settings settings;
  undefined4 local_2cc;
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  col1;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  col0;
  
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
            (&settings.operators,5);
  col1.super_Row_access_option.columnIndex_ = 0;
  col1.super_Row_access_option._4_4_ = 4;
  col1.super_Row_access_option.rows_._0_4_ = 1;
  col1.super_Row_access_option.rows_._4_4_ = 2;
  col1.super_Column_dimension_option.dim_ = 2;
  col1._20_4_ = 1;
  col1.column_._M_t._M_impl._0_4_ = 5;
  col1.column_._M_t._M_impl._4_4_ = 1;
  col1.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
  col1.column_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  __l._M_len = 5;
  __l._M_array = (iterator)&col1;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&col2,__l,(allocator_type *)&col3);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
  ::
  Set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
              *)&col0,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col2,&settings);
  if (col2.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col2.super_Row_access_option._0_8_,
                    CONCAT44(col2._20_4_,col2.super_Column_dimension_option.dim_) -
                    col2.super_Row_access_option._0_8_);
  }
  col2.super_Row_access_option._0_8_ =
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  col1.super_Row_access_option._0_8_ = col2.super_Row_access_option._0_8_;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>(Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>const&,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>&)::_lambda(Gudhi::persistence_matrix::Entry<Column_m___rix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>*>___1_>
            (&col0,(Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                    *)col2.super_Row_access_option._0_8_,(anon_class_1_0_00000001 *)&col3,
             (anon_class_8_1_e4bd5e45 *)&col1,(anon_class_8_1_e4bd5e45 *)&col2,
             (anon_class_1_0_00000001 *)&col4,(anon_class_1_0_00000001 *)&container_3);
  col1.super_Column_dimension_option.dim_ = 0;
  col1._20_4_ = 0;
  col1.column_._M_t._M_impl._0_4_ = 1;
  col1.super_Row_access_option.columnIndex_ = 0;
  col1.super_Row_access_option._4_4_ = 4;
  col1.super_Row_access_option.rows_._0_4_ = 1;
  col1.super_Row_access_option.rows_._4_4_ = 3;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col1);
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x386);
  pSVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    if (*(size_t *)((long)&(pSVar2->column_)._M_t._M_impl + 0x28) != 0) {
      lVar7 = std::_Rb_tree_decrement
                        ((_Rb_tree_node_base *)((long)&(pSVar2->column_)._M_t._M_impl + 8));
      uVar10 = *(int *)(*(long *)(lVar7 + 0x20) + 8) + 1;
      goto LAB_00160375;
    }
    col3.super_Row_access_option.columnIndex_ = 0;
    col3.super_Row_access_option._4_4_ = 0;
    col3.super_Row_access_option.rows_._0_4_ = 0;
    col3.super_Row_access_option.rows_._4_4_ = 0;
    col3.super_Column_dimension_option.dim_ = 0;
    col3._20_4_ = 0;
  }
  else {
LAB_00160375:
    col1.super_Row_access_option._0_8_ = col1.super_Row_access_option._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col3,(long)(int)uVar10,
               (value_type_conflict1 *)&col1,(allocator_type *)&col4);
    uVar5 = col3.super_Row_access_option._0_8_;
    p_Var8 = *(_Base_ptr *)((long)&(pSVar2->column_)._M_t._M_impl + 0x18);
    uVar3 = local_438;
    while (p_Var8 != (_Rb_tree_node_base *)((long)&(pSVar2->column_)._M_t._M_impl + 8U)) {
      local_438._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
      uVar1 = *(uint *)(*(long *)(p_Var8 + 1) + 8);
      if (uVar10 <= uVar1) break;
      *(undefined4 *)(uVar5 + (ulong)uVar1 * 4) = *(undefined4 *)(*(long *)(p_Var8 + 1) + 4);
      local_438 = (char *)uVar3;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      uVar3 = local_438;
    }
  }
  sVar9 = CONCAT44(col3.super_Row_access_option.rows_._4_4_,(uint)col3.super_Row_access_option.rows_
                  ) - col3.super_Row_access_option._0_8_;
  if (sVar9 == (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start) {
    if (CONCAT44(col3.super_Row_access_option.rows_._4_4_,(uint)col3.super_Row_access_option.rows_)
        == col3.super_Row_access_option._0_8_) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp((void *)col3.super_Row_access_option._0_8_,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  col2.super_Row_access_option.columnIndex_._0_1_ = bVar11;
  col2.super_Row_access_option.rows_._0_4_ = 0;
  col2.super_Row_access_option.rows_._4_4_ = 0;
  col2.super_Column_dimension_option.dim_ = 0;
  col2._20_4_ = 0;
  col4.super_Row_access_option._0_8_ = anon_var_dwarf_e4ee1;
  col4.super_Row_access_option.rows_._0_4_ = 0x208f3a;
  col4.super_Row_access_option.rows_._4_4_ = 0;
  col1.super_Row_access_option.rows_._0_4_ = (uint)col1.super_Row_access_option.rows_ & 0xffffff00;
  col1.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00249378;
  col1.super_Column_dimension_option.dim_ = 0x251128;
  col1._20_4_ = 0;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b0 = "";
  col1.column_._M_t._M_impl._0_8_ = &col4;
  boost::test_tools::tt_detail::report_assertion(&col2,&col1,&local_b8,0x386,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col2.super_Column_dimension_option);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
                    col3.super_Row_access_option._0_8_);
  }
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0x388);
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00249430;
  col3.super_Column_dimension_option.dim_ = 0x251128;
  col3._20_4_ = 0;
  col3.column_._M_t._M_impl._0_4_ = 0x2022e6;
  col3.column_._M_t._M_impl._4_4_ = 0;
  local_370 = *(char **)((long)&(((matrix->
                                  super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->column_)._M_t._M_impl
                        + 0x28);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_370;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_438;
  col4.super_Row_access_option.columnIndex_._0_1_ = local_370 == (char *)0x4;
  local_438 = (char *)CONCAT44(local_438._4_4_,4);
  col4.super_Row_access_option.rows_._0_4_ = 0;
  col4.super_Row_access_option.rows_._4_4_ = 0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_ccb23;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x202ead;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  col1.super_Row_access_option.rows_._0_4_ = (uint)col1.super_Row_access_option.rows_ & 0xffffff00;
  col1.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002493f0;
  col1.super_Column_dimension_option.dim_ = 0x251128;
  col1._20_4_ = 0;
  col2.column_._M_t._M_impl._0_8_ = &container_5;
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002496b0;
  col2.super_Column_dimension_option.dim_ = 0x251128;
  col2._20_4_ = 0;
  col1.column_._M_t._M_impl._0_8_ = (anon_class_1_0_00000001 *)&container_4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  col2.super_Row_access_option.columnIndex_ = 0;
  col2.super_Row_access_option._4_4_ = 1;
  col2.super_Row_access_option.rows_._0_4_ = 1;
  col2.super_Row_access_option.rows_._4_4_ = 3;
  col2.super_Column_dimension_option.dim_ = 2;
  col2._20_4_ = 4;
  col2.column_._M_t._M_impl._0_4_ = 5;
  col2.column_._M_t._M_impl._4_4_ = 4;
  col2.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
  col2.column_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 4;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&col2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&col3,__l_00,(allocator_type *)&col4);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
  ::
  Set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
              *)&col1,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col3,&settings);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
                    col3.super_Row_access_option._0_8_);
  }
  col3.super_Row_access_option._0_8_ =
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  col2.super_Row_access_option._0_8_ = col3.super_Row_access_option._0_8_;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>(Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>const&,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>&)::_lambda(Gudhi::persistence_matrix::Entry<Column_m___rix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>*>___1_>
            (&col1,(Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                    *)col3.super_Row_access_option._0_8_,(anon_class_1_0_00000001 *)&col4,
             (anon_class_8_1_e4bd5e45 *)&col2,(anon_class_8_1_e4bd5e45 *)&col3,
             (anon_class_1_0_00000001 *)&container_3,(anon_class_1_0_00000001 *)&container_4);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,0,0);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x38f);
  pSVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    if (*(size_t *)((long)&pSVar2[1].column_._M_t._M_impl + 0x28) != 0) {
      lVar7 = std::_Rb_tree_decrement
                        ((_Rb_tree_node_base *)((long)&pSVar2[1].column_._M_t._M_impl + 8));
      uVar10 = *(int *)(*(long *)(lVar7 + 0x20) + 8) + 1;
      goto LAB_0016077d;
    }
    col4.super_Row_access_option.columnIndex_ = 0;
    col4.super_Row_access_option._4_4_ = 0;
    col4.super_Row_access_option.rows_._0_4_ = 0;
    col4.super_Row_access_option.rows_._4_4_ = 0;
    col4.super_Column_dimension_option.dim_ = 0;
    col4._20_4_ = 0;
  }
  else {
LAB_0016077d:
    col2.super_Row_access_option._0_8_ = col2.super_Row_access_option._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,(long)(int)uVar10,
               (value_type_conflict1 *)&col2,(allocator_type *)&container_3);
    uVar5 = col4.super_Row_access_option._0_8_;
    p_Var8 = *(_Base_ptr *)((long)&pSVar2[1].column_._M_t._M_impl + 0x18);
    uVar3 = local_4c0;
    while (p_Var8 != (_Rb_tree_node_base *)((long)&pSVar2[1].column_._M_t._M_impl + 8U)) {
      local_4c0._4_4_ = (uint)((ulong)uVar3 >> 0x20);
      uVar1 = *(uint *)(*(long *)(p_Var8 + 1) + 8);
      if (uVar10 <= uVar1) break;
      *(undefined4 *)(uVar5 + (ulong)uVar1 * 4) = *(undefined4 *)(*(long *)(p_Var8 + 1) + 4);
      local_4c0 = (undefined8 *)uVar3;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      uVar3 = local_4c0;
    }
  }
  sVar9 = CONCAT44(col4.super_Row_access_option.rows_._4_4_,(uint)col4.super_Row_access_option.rows_
                  ) - col4.super_Row_access_option._0_8_;
  if (sVar9 == (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start) {
    if (CONCAT44(col4.super_Row_access_option.rows_._4_4_,(uint)col4.super_Row_access_option.rows_)
        == col4.super_Row_access_option._0_8_) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp((void *)col4.super_Row_access_option._0_8_,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  col3.super_Row_access_option.columnIndex_._0_1_ = bVar11;
  col3.super_Row_access_option.rows_._0_4_ = 0;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_e4f16;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x208f7e;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00249378;
  col2.super_Column_dimension_option.dim_ = 0x251128;
  col2._20_4_ = 0;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_100 = "";
  col2.column_._M_t._M_impl._0_8_ = (anon_class_1_0_00000001 *)&container_3;
  boost::test_tools::tt_detail::report_assertion(&col3,&col2,&local_108,0x38f,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col3.super_Column_dimension_option);
  if (col4.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col4.super_Row_access_option._0_8_,
                    CONCAT44(col4._20_4_,col4.super_Column_dimension_option.dim_) -
                    col4.super_Row_access_option._0_8_);
  }
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x391);
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00249430;
  col4.super_Column_dimension_option.dim_ = 0x251128;
  col4._20_4_ = 0;
  col4.column_._M_t._M_impl._0_4_ = 0x2022e6;
  col4.column_._M_t._M_impl._4_4_ = 0;
  local_438 = *(char **)((long)&(matrix->
                                super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[1].column_._M_t._M_impl +
                        0x28);
  local_370 = (char *)&local_4c0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,local_438 == (char *)0x0);
  local_4c0 = (undefined8 *)((ulong)local_4c0._4_4_ << 0x20);
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_ccb23;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x202ead;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_438;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002493f0;
  col2.super_Column_dimension_option.dim_ = 0x251128;
  col2._20_4_ = 0;
  col2.column_._M_t._M_impl._0_8_ = &container_5;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002496b0;
  col3.super_Column_dimension_option.dim_ = 0x251128;
  col3._20_4_ = 0;
  col3.column_._M_t._M_impl._0_8_ = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (&container_3,&col4,&container_4,0x391,1,2,2,"matrix[1].size()",&col2,"0",&col3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  col2.super_Row_access_option.columnIndex_ = 4;
  Gudhi::persistence_matrix::
  _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((Field_element *)&col2,&col1,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 4);
  col2.super_Column_dimension_option.dim_ = 0;
  col2._20_4_ = 0;
  col2.column_._M_t._M_impl._0_4_ = 4;
  col2.super_Row_access_option.columnIndex_ = 0;
  col2.super_Row_access_option._4_4_ = 1;
  col2.super_Row_access_option.rows_._0_4_ = 4;
  col2.super_Row_access_option.rows_._4_4_ = 2;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col2);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x397);
  pSVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    if (*(size_t *)((long)&pSVar2[4].column_._M_t._M_impl + 0x28) != 0) {
      lVar7 = std::_Rb_tree_decrement
                        ((_Rb_tree_node_base *)((long)&pSVar2[4].column_._M_t._M_impl + 8));
      uVar10 = *(int *)(*(long *)(lVar7 + 0x20) + 8) + 1;
      goto LAB_00160b08;
    }
    col4.super_Row_access_option.columnIndex_ = 0;
    col4.super_Row_access_option._4_4_ = 0;
    col4.super_Row_access_option.rows_._0_4_ = 0;
    col4.super_Row_access_option.rows_._4_4_ = 0;
    col4.super_Column_dimension_option.dim_ = 0;
    col4._20_4_ = 0;
  }
  else {
LAB_00160b08:
    col2.super_Row_access_option._0_8_ = col2.super_Row_access_option._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,(long)(int)uVar10,
               (value_type_conflict1 *)&col2,(allocator_type *)&container_3);
    uVar3 = col4.super_Row_access_option._0_8_;
    p_Var8 = *(_Base_ptr *)((long)&pSVar2[4].column_._M_t._M_impl + 0x18);
    while (p_Var8 != (_Rb_tree_node_base *)((long)&pSVar2[4].column_._M_t._M_impl + 8U)) {
      uVar1 = *(uint *)(*(long *)(p_Var8 + 1) + 8);
      if (uVar10 <= uVar1) break;
      *(undefined4 *)(uVar3 + (ulong)uVar1 * 4) = *(undefined4 *)(*(long *)(p_Var8 + 1) + 4);
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    }
  }
  sVar9 = CONCAT44(col4.super_Row_access_option.rows_._4_4_,(uint)col4.super_Row_access_option.rows_
                  ) - col4.super_Row_access_option._0_8_;
  if (sVar9 == (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start) {
    if (CONCAT44(col4.super_Row_access_option.rows_._4_4_,(uint)col4.super_Row_access_option.rows_)
        == col4.super_Row_access_option._0_8_) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp((void *)col4.super_Row_access_option._0_8_,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  col3.super_Row_access_option.columnIndex_._0_1_ = bVar11;
  col3.super_Row_access_option.rows_._0_4_ = 0;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_e4f3d;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x208fc2;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00249378;
  col2.super_Column_dimension_option.dim_ = 0x251128;
  col2._20_4_ = 0;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_150 = "";
  col2.column_._M_t._M_impl._0_8_ = &container_3;
  boost::test_tools::tt_detail::report_assertion(&col3,&col2,&local_158,0x397,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col3.super_Column_dimension_option);
  if (col4.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col4.super_Row_access_option._0_8_,
                    CONCAT44(col4._20_4_,col4.super_Column_dimension_option.dim_) -
                    col4.super_Row_access_option._0_8_);
  }
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x399);
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00249430;
  col4.super_Column_dimension_option.dim_ = 0x251128;
  col4._20_4_ = 0;
  col4.column_._M_t._M_impl._0_4_ = 0x2022e6;
  col4.column_._M_t._M_impl._4_4_ = 0;
  local_438 = *(char **)((long)&(matrix->
                                super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[4].column_._M_t._M_impl +
                        0x28);
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002493f0;
  col2.super_Column_dimension_option.dim_ = 0x251128;
  col2._20_4_ = 0;
  col2.column_._M_t._M_impl._0_8_ = &container_5;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,local_438 == (char *)0x4);
  local_4c0 = (undefined8 *)CONCAT44(local_4c0._4_4_,4);
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_ccb23;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x202ead;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_438;
  local_370 = (char *)&local_4c0;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002496b0;
  col3.super_Column_dimension_option.dim_ = 0x251128;
  col3._20_4_ = 0;
  col3.column_._M_t._M_impl._0_8_ = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (&container_3,&col4,&container_4,0x399,1,2,2,"matrix[4].size()",&col2,"4",&col3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  col3.super_Row_access_option.columnIndex_ = 0;
  col3.super_Row_access_option._4_4_ = 0;
  col3.super_Row_access_option.rows_._0_4_ = 0;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
  ::
  Set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
              *)&col2,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col3,&settings);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
                    col3.super_Row_access_option._0_8_);
  }
  col3.super_Row_access_option.columnIndex_ = 3;
  Gudhi::persistence_matrix::
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((Field_element *)&col3,&col2,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5);
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 1;
  col3.column_._M_t._M_impl._0_4_ = 1;
  col3.super_Row_access_option.columnIndex_ = 4;
  col3.super_Row_access_option._4_4_ = 2;
  col3.super_Row_access_option.rows_._0_4_ = 1;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col3);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x39f);
  pSVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    if (*(size_t *)((long)&pSVar2[5].column_._M_t._M_impl + 0x28) != 0) {
      lVar7 = std::_Rb_tree_decrement
                        ((_Rb_tree_node_base *)((long)&pSVar2[5].column_._M_t._M_impl + 8));
      uVar10 = *(int *)(*(long *)(lVar7 + 0x20) + 8) + 1;
      goto LAB_00160edf;
    }
    container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  else {
LAB_00160edf:
    col3.super_Row_access_option._0_8_ = col3.super_Row_access_option._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&container_3,(long)(int)uVar10,(value_type_conflict1 *)&col3,
               (allocator_type *)&container_4);
    puVar4 = container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var8 = *(_Base_ptr *)((long)&pSVar2[5].column_._M_t._M_impl + 0x18);
    uVar3 = local_440;
    while (p_Var8 != (_Rb_tree_node_base *)((long)&pSVar2[5].column_._M_t._M_impl + 8U)) {
      local_440._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
      uVar1 = *(uint *)(*(long *)(p_Var8 + 1) + 8);
      if (uVar10 <= uVar1) break;
      puVar4[uVar1] = *(uint *)(*(long *)(p_Var8 + 1) + 4);
      local_440 = (undefined4 *)uVar3;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      uVar3 = local_440;
    }
  }
  sVar9 = (long)CONCAT44(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         (uint)container_3.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish) -
          (long)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (sVar9 == (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start) {
    if ((pointer)CONCAT44(container_3.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish._4_4_,
                          (uint)container_3.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish) ==
        container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  col4.super_Row_access_option.columnIndex_._0_1_ = bVar11;
  col4.super_Row_access_option.rows_._0_4_ = 0;
  col4.super_Row_access_option.rows_._4_4_ = 0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_e4f57;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x209004;
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00249378;
  col3.super_Column_dimension_option.dim_ = 0x251128;
  col3._20_4_ = 0;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a0 = "";
  col3.column_._M_t._M_impl._0_8_ = &container_4;
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_1a8,0x39f,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  if (container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(container_3.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,
                             container_3.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)container_3.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x3a0);
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish & 0xffffff00;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00249430;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x251128;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_4c0 = *(undefined8 **)
               ((long)&(matrix->
                       super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[5].column_._M_t._M_impl + 0x28);
  local_438 = (char *)&local_440;
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002493f0;
  col3.super_Column_dimension_option.dim_ = 0x251128;
  col3._20_4_ = 0;
  col3.column_._M_t._M_impl._0_8_ = &local_370;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_4c0 == (undefined8 *)0x5);
  local_440 = (undefined4 *)CONCAT44(local_440._4_4_,5);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_ccb23;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x202ead;
  local_370 = (char *)&local_4c0;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002496b0;
  col4.super_Column_dimension_option.dim_ = 0x251128;
  col4._20_4_ = 0;
  col4.column_._M_t._M_impl._0_8_ = &local_438;
  boost::test_tools::tt_detail::report_assertion
            (&container_4,&container_3,&container_5,0x3a0,1,2,2,"matrix[5].size()",&col3,"5",&col4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  col4.super_Row_access_option.columnIndex_ = 0;
  col4.super_Row_access_option._4_4_ = 3;
  col4.super_Row_access_option.rows_._0_4_ = 2;
  col4.super_Row_access_option.rows_._4_4_ = 1;
  col4.super_Column_dimension_option.dim_ = 3;
  col4._20_4_ = 2;
  col4.column_._M_t._M_impl._0_4_ = 5;
  col4.column_._M_t._M_impl._4_4_ = 2;
  col4.column_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 6;
  col4.column_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&col4;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&container_3,__l_01,(allocator_type *)&container_4);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
  ::
  Set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
              *)&col3,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&container_3,&settings);
  if (container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(container_3.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,
                             container_3.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)container_3.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  col4.super_Row_access_option.columnIndex_ = 3;
  Gudhi::persistence_matrix::
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((Field_element *)&col4,&col3,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5);
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 2;
  col4.column_._M_t._M_impl._0_4_ = 4;
  col4.super_Row_access_option.columnIndex_ = 3;
  col4.super_Row_access_option._4_4_ = 2;
  col4.super_Row_access_option.rows_._0_4_ = 4;
  col4.super_Row_access_option.rows_._4_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col4);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x3a5);
  pSVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    if (*(size_t *)((long)&pSVar2[5].column_._M_t._M_impl + 0x28) != 0) {
      lVar7 = std::_Rb_tree_decrement
                        ((_Rb_tree_node_base *)((long)&pSVar2[5].column_._M_t._M_impl + 8));
      uVar10 = *(int *)(*(long *)(lVar7 + 0x20) + 8) + 1;
      goto LAB_001612c1;
    }
    container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
LAB_001612c1:
    col4.super_Row_access_option._0_8_ = col4.super_Row_access_option._0_8_ & 0xffffffff00000000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&container_4,(long)(int)uVar10,(value_type_conflict1 *)&col4,
               (allocator_type *)&container_5);
    puVar4 = container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var8 = *(_Base_ptr *)((long)&pSVar2[5].column_._M_t._M_impl + 0x18);
    uVar3 = local_300;
    while (p_Var8 != (_Rb_tree_node_base *)((long)&pSVar2[5].column_._M_t._M_impl + 8U)) {
      local_300._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
      uVar1 = *(uint *)(*(long *)(p_Var8 + 1) + 8);
      if (uVar10 <= uVar1) break;
      puVar4[uVar1] = *(uint *)(*(long *)(p_Var8 + 1) + 4);
      local_300 = uVar3;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      uVar3 = local_300;
    }
  }
  if ((long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar11);
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_e4f57;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x209004;
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00249378;
  col4.super_Column_dimension_option.dim_ = 0x251128;
  col4._20_4_ = 0;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f0 = "";
  col4.column_._M_t._M_impl._0_8_ = &container_5;
  boost::test_tools::tt_detail::report_assertion(&container_3,&col4,&local_1f8,0x3a5,1,0,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)container_4.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)container_4.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x3a7);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00249430;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_440 = *(undefined4 **)
               ((long)&(matrix->
                       super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[5].column_._M_t._M_impl + 0x28);
  local_4c0 = &local_300;
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002493f0;
  col4.super_Column_dimension_option.dim_ = 0x251128;
  col4._20_4_ = 0;
  col4.column_._M_t._M_impl._0_8_ = &local_438;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_440 == (undefined4 *)0x6);
  local_300 = CONCAT44(local_300._4_4_,6);
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish & 0xffffff00;
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_368 = "";
  local_438 = (char *)&local_440;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_002496b0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x251128;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  boost::test_tools::tt_detail::report_assertion
            (&container_5,&container_4,&local_370,0x3a7,1,2,2,"matrix[5].size()",&col4,"6",
             &container_3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x300000000;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 1;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 2;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  __l_02._M_len = 6;
  __l_02._M_array = (iterator)&container_3;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&container_4,__l_02,(allocator_type *)&container_5);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
  ::
  Set_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>
              *)&col4,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&container_4,&settings);
  if (container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)container_4.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)container_4.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  Gudhi::persistence_matrix::
  _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>
            ((Field_element *)&container_3,&col4,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 3);
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200000003;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 4;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&container_3);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x3ad);
  pSVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)veccont.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)veccont.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar10 < 0) {
    if (*(size_t *)((long)&pSVar2[3].column_._M_t._M_impl + 0x28) == 0) {
      container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_001616fe;
    }
    lVar7 = std::_Rb_tree_decrement
                      ((_Rb_tree_node_base *)((long)&pSVar2[3].column_._M_t._M_impl + 8));
    uVar10 = *(int *)(*(long *)(lVar7 + 0x20) + 8) + 1;
  }
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&container_5,(long)(int)uVar10,(value_type_conflict1 *)&container_3,
             (allocator_type *)&local_370);
  puVar4 = container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var8 = *(_Base_ptr *)((long)&pSVar2[3].column_._M_t._M_impl + 0x18);
  while (p_Var8 != (_Rb_tree_node_base *)((long)&pSVar2[3].column_._M_t._M_impl + 8U)) {
    uVar1 = *(uint *)(*(long *)(p_Var8 + 1) + 8);
    if (uVar10 <= uVar1) break;
    puVar4[uVar1] = *(uint *)(*(long *)(p_Var8 + 1) + 4);
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  }
LAB_001616fe:
  if ((long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp(container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar11);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_370 = "matrix[3].get_content(veccont.size()) == veccont";
  local_368 = "";
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish & 0xffffff00;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00249378;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x251128;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_240 = "";
  boost::test_tools::tt_detail::report_assertion(&container_4,&container_3,&local_248,0x3ad,1,0,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)container_5.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)container_5.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_250 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x3af);
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00249430;
  container_5.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_300 = *(size_t *)
               ((long)&(matrix->
                       super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[3].column_._M_t._M_impl + 0x28);
  local_440 = &local_2cc;
  local_370 = (char *)CONCAT71(local_370._1_7_,local_300 == 6);
  local_2cc = 6;
  local_368 = (char *)0x0;
  sStack_360.pi_ = (sp_counted_base *)0x0;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_430 = "";
  local_4c0 = &local_300;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ =
       (uint)container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish & 0xffffff00;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_002493f0;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x251128;
  container_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_002496b0;
  container_4.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_360);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::~Set_column(&col4);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::~Set_column(&col3);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::~Set_column(&col2);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::~Set_column(&col1);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
  ::~Set_column(&col0);
  if (settings.operators.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(settings.operators.inverse_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)settings.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)settings.operators.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void column_test_boundary_z5_operators(std::vector<Column>& matrix) {
  using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;

  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings(5);

  const Column col0(cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, &settings);
  matrix[0] += col0;

  veccont = {0, 4, 1, 3, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 4);
  }

  const Column col1(cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(4, col1);
  veccont = {0, 1, 4, 2, 0, 0, 4};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 4);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {4, 2, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  // this = this + column * v
  const Column col3(cont{{0, 3}, {2, 1}, {3, 2}, {5, 2}, {6, 1}}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 6);
  }
  // this = v * this + column
  const Column col4(cont{{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 6);
  }
}